

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O0

QPixmap * __thiscall
QPixmap::transformed(QPixmap *this,QTransform *transform,TransformationMode mode)

{
  bool bVar1;
  TransformationType TVar2;
  QPlatformPixmap *pQVar3;
  uint in_ECX;
  undefined8 in_RDX;
  QPixmap *in_RSI;
  QPixmap *in_RDI;
  QPixmap *pQVar4;
  undefined4 in_stack_ffffffffffffffe0;
  
  pQVar4 = in_RDI;
  bVar1 = isNull(in_RDI);
  if ((!bVar1) && (TVar2 = QTransform::type((QTransform *)in_RSI), 1 < (int)TVar2)) {
    pQVar3 = QExplicitlySharedDataPointer<QPlatformPixmap>::operator->
                       ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x3229b7);
    (*pQVar3->_vptr_QPlatformPixmap[0x10])(in_RDI,pQVar3,in_RDX,(ulong)in_ECX);
    return pQVar4;
  }
  QPixmap((QPixmap *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RSI);
  return pQVar4;
}

Assistant:

QPixmap QPixmap::transformed(const QTransform &transform,
                             Qt::TransformationMode mode) const
{
    if (isNull() || transform.type() <= QTransform::TxTranslate)
        return *this;

    return data->transformed(transform, mode);
}